

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RPLIDAR.h
# Opt level: O3

int GetStartupMessageRPLIDAR(RPLIDAR *pRPLIDAR)

{
  int iVar1;
  int iVar2;
  ssize_t sVar3;
  bool bVar4;
  fd_set sock_set;
  timespec req;
  timeval local_4c8;
  fd_set local_4b8;
  timespec local_438 [64];
  
  local_438[0].tv_sec = 0;
  local_438[0].tv_nsec = 100000000;
  nanosleep(local_438,(timespec *)0x0);
  iVar2 = (pRPLIDAR->RS232Port).DevType;
  if (iVar2 - 1U < 4) {
    iVar2 = (pRPLIDAR->RS232Port).s;
    local_4c8.tv_sec = 0;
    local_4c8.tv_usec = 0;
    local_4b8.fds_bits[0] = 0;
    local_4b8.fds_bits[1] = 0;
    local_4b8.fds_bits[2] = 0;
    local_4b8.fds_bits[3] = 0;
    local_4b8.fds_bits[4] = 0;
    local_4b8.fds_bits[5] = 0;
    local_4b8.fds_bits[6] = 0;
    local_4b8.fds_bits[7] = 0;
    local_4b8.fds_bits[8] = 0;
    local_4b8.fds_bits[9] = 0;
    local_4b8.fds_bits[10] = 0;
    local_4b8.fds_bits[0xb] = 0;
    iVar1 = iVar2 + 0x3f;
    if (-1 < iVar2) {
      iVar1 = iVar2;
    }
    local_4b8.fds_bits[0xc] = 0;
    local_4b8.fds_bits[0xd] = 0;
    local_4b8.fds_bits[0xe] = 0;
    local_4b8.fds_bits[0xf] = 0;
    local_4b8.fds_bits[iVar1 >> 6] =
         local_4b8.fds_bits[iVar1 >> 6] | 1L << ((byte)(iVar2 % 0x40) & 0x3f);
    iVar1 = select(iVar2 + 1,&local_4b8,(fd_set *)0x0,(fd_set *)0x0,&local_4c8);
    if (0 < iVar1) {
      do {
        sVar3 = recv(iVar2,local_438,0x400,0);
        if (sVar3 < 1) {
          bVar4 = true;
          goto LAB_00121fd6;
        }
        local_4c8.tv_sec = 0;
        local_4c8.tv_usec = 0;
        iVar1 = select(iVar2 + 1,&local_4b8,(fd_set *)0x0,(fd_set *)0x0,&local_4c8);
      } while (0 < iVar1);
    }
    bVar4 = iVar1 == -1;
  }
  else {
    if (iVar2 != 0) goto LAB_001220c5;
    iVar2 = tcflush(*(int *)&(pRPLIDAR->RS232Port).hDev,2);
    bVar4 = iVar2 != 0;
  }
LAB_00121fd6:
  if (!bVar4) {
    iVar2 = (pRPLIDAR->RS232Port).DevType;
    if (iVar2 - 1U < 4) {
      iVar2 = (pRPLIDAR->RS232Port).s;
      local_4c8.tv_sec = 0;
      local_4c8.tv_usec = 0;
      local_4b8.fds_bits[0] = 0;
      local_4b8.fds_bits[1] = 0;
      local_4b8.fds_bits[2] = 0;
      local_4b8.fds_bits[3] = 0;
      local_4b8.fds_bits[4] = 0;
      local_4b8.fds_bits[5] = 0;
      local_4b8.fds_bits[6] = 0;
      local_4b8.fds_bits[7] = 0;
      local_4b8.fds_bits[8] = 0;
      local_4b8.fds_bits[9] = 0;
      local_4b8.fds_bits[10] = 0;
      local_4b8.fds_bits[0xb] = 0;
      iVar1 = iVar2 + 0x3f;
      if (-1 < iVar2) {
        iVar1 = iVar2;
      }
      local_4b8.fds_bits[0xc] = 0;
      local_4b8.fds_bits[0xd] = 0;
      local_4b8.fds_bits[0xe] = 0;
      local_4b8.fds_bits[0xf] = 0;
      local_4b8.fds_bits[iVar1 >> 6] =
           local_4b8.fds_bits[iVar1 >> 6] | 1L << ((byte)(iVar2 % 0x40) & 0x3f);
      iVar1 = select(iVar2 + 1,&local_4b8,(fd_set *)0x0,(fd_set *)0x0,&local_4c8);
      if (0 < iVar1) {
        do {
          sVar3 = recv(iVar2,local_438,0x400,0);
          if (sVar3 < 1) {
            bVar4 = true;
            goto LAB_001220c1;
          }
          local_4c8.tv_sec = 0;
          local_4c8.tv_usec = 0;
          iVar1 = select(iVar2 + 1,&local_4b8,(fd_set *)0x0,(fd_set *)0x0,&local_4c8);
        } while (0 < iVar1);
      }
      bVar4 = iVar1 == -1;
    }
    else {
      if (iVar2 != 0) goto LAB_001220c5;
      iVar2 = tcflush(*(int *)&(pRPLIDAR->RS232Port).hDev,2);
      bVar4 = iVar2 != 0;
    }
LAB_001220c1:
    if (!bVar4) {
      return 0;
    }
  }
LAB_001220c5:
  puts("Error purging data from a RPLIDAR. ");
  return 1;
}

Assistant:

inline int GetStartupMessageRPLIDAR(RPLIDAR* pRPLIDAR)
{
#ifdef ENABLE_RPLIDAR_SDK_SUPPORT
	mSleep(100);
#ifdef FORCE_RPLIDAR_SDK_V1
	if (IS_FAIL(pRPLIDAR->drv->clearNetSerialRxCache()))
	{
		printf("A RPLIDAR is not responding correctly : clearNetSerialRxCache() failed. \n");
		return EXIT_FAILURE;
	}
#else
	pRPLIDAR->channel->flush();
#endif // FORCE_RPLIDAR_SDK_V1
#else
	//unsigned char databuf[57]; // A2...
	//unsigned char databuf[MAX_NB_BYTES_RPLIDAR];
	//int nbReadBytes = 0;

	//// Undocumented response for A2...
	//memset(databuf, 0, sizeof(databuf));
	//if (ReadAllRS232Port(&pRPLIDAR->RS232Port, databuf, sizeof(databuf)) != EXIT_SUCCESS)
	//{ 
	//	printf("A RPLIDAR is not responding correctly. \n");
	//	return EXIT_FAILURE;	
	//}

	// Undocumented response...
	mSleep(100);

	//memset(databuf, 0, sizeof(databuf));
	//if (ReadRS232Port(&pRPLIDAR->RS232Port, databuf, sizeof(databuf), &nbReadBytes) != EXIT_SUCCESS)
	//{ 
	//	//printf("Warning : A RPLIDAR might not be responding correctly. \n");
	//	//return EXIT_FAILURE;	
	//}

	if (PurgeRS232Port(&pRPLIDAR->RS232Port) != EXIT_SUCCESS)
	{
		printf("Error purging data from a RPLIDAR. \n");
		return EXIT_FAILURE;
	}
	// Need to purge twice on Mac OS otherwise next read() would fail...?
	if (PurgeRS232Port(&pRPLIDAR->RS232Port) != EXIT_SUCCESS)
	{
		printf("Error purging data from a RPLIDAR. \n");
		return EXIT_FAILURE;
	}
#endif // ENABLE_RPLIDAR_SDK_SUPPORT

	return EXIT_SUCCESS;
}